

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3D.h
# Opt level: O3

bool __thiscall CMU462::StaticScene::Triangle::intersect(Triangle *this,Ray *r)

{
  double dVar1;
  size_t sVar2;
  Vector3D *pVVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar6 = (r->d).x;
  dVar12 = (r->d).y;
  dVar1 = (r->d).z;
  sVar2 = this->v1;
  pVVar3 = this->mesh->positions;
  dVar7 = pVVar3[sVar2].x;
  dVar16 = pVVar3[sVar2].y;
  dVar18 = pVVar3[sVar2].z;
  sVar2 = this->v2;
  sVar4 = this->v3;
  dVar10 = pVVar3[sVar2].x - dVar7;
  dVar17 = pVVar3[sVar2].y - dVar16;
  dVar13 = pVVar3[sVar2].z - dVar18;
  dVar15 = pVVar3[sVar4].x - dVar7;
  dVar5 = pVVar3[sVar4].y - dVar16;
  dVar9 = dVar17 * dVar1 - dVar12 * dVar13;
  dVar14 = dVar13 * dVar6 - dVar1 * dVar10;
  dVar11 = dVar10 * dVar12 - dVar6 * dVar17;
  dVar20 = pVVar3[sVar4].z - dVar18;
  dVar8 = dVar11 * dVar20 + dVar9 * dVar15 + dVar14 * dVar5;
  if (1e-05 <= dVar8) {
    dVar7 = (r->o).x - dVar7;
    dVar16 = (r->o).y - dVar16;
    dVar18 = (r->o).z - dVar18;
    dVar19 = dVar16 * dVar20 - dVar5 * dVar18;
    dVar20 = dVar18 * dVar15 - dVar20 * dVar7;
    dVar5 = dVar7 * dVar5 - dVar15 * dVar16;
    dVar6 = -(dVar1 * dVar5 + dVar6 * dVar19 + dVar12 * dVar20) / dVar8;
    if ((((0.0 <= dVar6) && (dVar6 <= 1.0)) &&
        (dVar12 = (dVar11 * dVar18 + dVar9 * dVar7 + dVar16 * dVar14) / dVar8, 0.0 <= dVar12)) &&
       (((dVar12 + dVar6 <= 1.0 &&
         (dVar8 = -(dVar5 * dVar13 + dVar19 * dVar10 + dVar17 * dVar20) / dVar8,
         dVar8 < r->max_t || dVar8 == r->max_t)) && (r->min_t <= dVar8)))) {
      r->max_t = dVar8;
      return true;
    }
  }
  return false;
}

Assistant:

Vector3D( const Vector3D& v ) : x( v.x ), y( v.y ), z( v.z ) { }